

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pqmf.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  string *this;
  char *__s;
  int iVar7;
  int num_subband;
  int num_filter_order;
  int num_iteration;
  double initial_step_size;
  double convergence_threshold;
  double attenuation;
  double input;
  ostringstream error_message_8;
  Buffer buffer;
  vector<double,_std::allocator<double>_> output;
  PseudoQuadratureMirrorFilterBanks analysis;
  ifstream ifs;
  int local_484 [4];
  int local_474;
  uint local_470;
  int local_46c;
  string local_468;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  string local_428 [3];
  ios_base local_3b8 [264];
  Buffer local_2b0;
  vector<double,_std::allocator<double>_> local_290;
  PseudoQuadratureMirrorFilterBanks local_278;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_484[0] = 4;
  local_474 = 0x2f;
  local_438 = 100.0;
  local_46c = 100;
  local_440 = 1e-06;
  local_448 = 0.01;
  local_484[1] = 0;
  local_484[2] = 0;
  local_470 = 0x47ae1401;
  do {
    iVar4 = ya_getopt_long(argc,argv,"k:m:a:i:d:s:rh",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x61:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_428);
      bVar3 = sptk::ConvertStringToDouble(&local_238,&local_438);
      bVar1 = local_438 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -a option must be a positive number",
                   0x38);
        local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
        sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
LAB_00103d42:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
          operator_delete(local_428[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        goto LAB_00103d72;
      }
      break;
    case 0x62:
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
switchD_00103915_caseD_62:
      anon_unknown.dwarf_3864::PrintUsage((ostream *)&std::cerr);
LAB_00103d72:
      iVar7 = 1;
      local_484[1] = 1;
      local_484[2] = 0;
      goto LAB_00103d81;
    case 100:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_428);
      bVar3 = sptk::ConvertStringToDouble(&local_238,&local_440);
      bVar1 = local_440 < 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,
                   "The argument for the -d option must be a non-negative number",0x3c);
        local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
        sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
        goto LAB_00103d42;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_3864::PrintUsage((ostream *)&std::cout);
      local_484[1] = 0;
      local_484[2] = 0;
      iVar7 = 1;
      goto LAB_00103d81;
    case 0x69:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_428);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_46c);
      bVar1 = local_46c < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -i option must be a positive integer"
                   ,0x39);
        local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
        sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
        goto LAB_00103d42;
      }
      break;
    case 0x6b:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_428);
      bVar3 = sptk::ConvertStringToInteger(&local_238,local_484);
      bVar1 = local_484[0] < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -k option must be a positive integer"
                   ,0x39);
        local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
        sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
        goto LAB_00103d42;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_428);
      bVar3 = sptk::ConvertStringToInteger(&local_238,&local_474);
      bVar1 = local_474 < 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be greater than 1",
                   0x35);
        local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
        sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
        goto LAB_00103d42;
      }
      break;
    case 0x72:
      iVar7 = 0;
      local_470 = 0;
      goto LAB_00103d81;
    case 0x73:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_428);
      bVar3 = sptk::ConvertStringToDouble(&local_238,&local_448);
      bVar1 = local_448 <= 0.0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar3 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -s option must be a positive number",
                   0x38);
        local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
        sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
        goto LAB_00103d42;
      }
      break;
    default:
      iVar7 = 2;
      if (iVar4 != -1) goto switchD_00103915_caseD_62;
      goto LAB_00103d81;
    }
    iVar7 = 0;
LAB_00103d81:
  } while (iVar7 == 0);
  if (iVar7 != 2) {
    return (int)local_484._4_8_;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
    sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
LAB_00103f5e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
      operator_delete(local_428[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    return 1;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  this = &local_238;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_428[0]._M_dataplus._M_p = (pointer)&local_428[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"pqmf","");
    sptk::PrintErrorMessage(local_428,(ostringstream *)&local_238);
    goto LAB_00103f5e;
  }
  std::ifstream::ifstream(this);
  if ((__s != (char *)0x0) &&
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_428,"Cannot open file ",0x11);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_428,__s,sVar6);
    local_278._vptr_PseudoQuadratureMirrorFilterBanks = (_func_int **)&local_278.all_zero_filter_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"pqmf","");
    sptk::PrintErrorMessage((string *)&local_278,(ostringstream *)local_428);
    if ((AllZeroDigitalFilter *)local_278._vptr_PseudoQuadratureMirrorFilterBanks !=
        &local_278.all_zero_filter_) {
      operator_delete(local_278._vptr_PseudoQuadratureMirrorFilterBanks);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
    std::ios_base::~ios_base(local_3b8);
    iVar5 = 1;
    goto LAB_001043e1;
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    this = (string *)&std::cin;
  }
  sptk::PseudoQuadratureMirrorFilterBanks::PseudoQuadratureMirrorFilterBanks
            (&local_278,local_484[0],local_474,local_438,local_46c,local_440,local_448);
  local_2b0._vptr_Buffer = (_func_int **)&PTR__Buffer_00113b48;
  local_2b0.buffer_for_all_zero_filter_.
  super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b0.buffer_for_all_zero_filter_.
  super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b0.buffer_for_all_zero_filter_.
  super__Vector_base<sptk::AllZeroDigitalFilter::Buffer_*,_std::allocator<sptk::AllZeroDigitalFilter::Buffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_278.is_valid_ != false) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_290,(long)local_484[0],(allocator_type *)local_428);
    bVar1 = sptk::IsEven(local_474);
    iVar7 = (int)(local_474 - (uint)!bVar1) / 2;
    iVar4 = 0;
    do {
      bVar1 = sptk::ReadStream<double>(&local_430,(istream *)this);
      if (!bVar1) {
        iVar5 = (int)local_484._4_8_;
        if ((local_470 & 1) == 0) goto LAB_001043a8;
        if (iVar4 < iVar7) {
          iVar7 = iVar4;
        }
        bVar1 = 0 < iVar7;
        if (iVar7 < 1) goto LAB_001043a2;
        iVar4 = 1;
        goto LAB_001041e4;
      }
      bVar1 = sptk::PseudoQuadratureMirrorFilterBanks::Run
                        (&local_278,local_430,&local_290,&local_2b0);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_428,"Failed to perform PQMF analysis",0x1f);
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"pqmf","");
        sptk::PrintErrorMessage(&local_468,(ostringstream *)local_428);
        goto LAB_00104297;
      }
    } while ((((local_470 & 1) != 0) &&
             (iVar5 = iVar4 + 1, bVar1 = iVar4 < iVar7, iVar4 = iVar5, bVar1)) ||
            (bVar1 = sptk::WriteStream<double>
                               (0,local_484[0],&local_290,(ostream *)&std::cout,(int *)0x0), bVar1))
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_428,"Failed to write subband signals",0x1f);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"pqmf","");
    sptk::PrintErrorMessage(&local_468,(ostringstream *)local_428);
LAB_00104297:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
    std::ios_base::~ios_base(local_3b8);
    iVar5 = 1;
    goto LAB_001043aa;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_428,"Failed to initialize PseudoQuadratureMirrorFilterBanks",0x36);
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"pqmf","");
  sptk::PrintErrorMessage(&local_468,(ostringstream *)local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
  std::ios_base::~ios_base(local_3b8);
  iVar5 = 1;
  goto LAB_001043bc;
  while( true ) {
    bVar3 = sptk::WriteStream<double>(0,local_484[0],&local_290,(ostream *)&std::cout,(int *)0x0);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_428,"Failed to write subband signals",0x1f);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"pqmf","");
      sptk::PrintErrorMessage(&local_468,(ostringstream *)local_428);
      goto LAB_00104370;
    }
    bVar1 = iVar4 < iVar7;
    bVar3 = iVar4 == iVar7;
    iVar4 = iVar4 + 1;
    if (bVar3) break;
LAB_001041e4:
    bVar3 = sptk::PseudoQuadratureMirrorFilterBanks::Run(&local_278,local_430,&local_290,&local_2b0)
    ;
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_428);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_428,"Failed to perform PQMF analysis",0x1f);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"pqmf","");
      sptk::PrintErrorMessage(&local_468,(ostringstream *)local_428);
LAB_00104370:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_428);
      std::ios_base::~ios_base(local_3b8);
      iVar5 = 1;
      goto LAB_001043a2;
    }
  }
  iVar5 = (int)local_484._4_8_;
LAB_001043a2:
  if (!bVar1) {
LAB_001043a8:
    iVar5 = 0;
  }
LAB_001043aa:
  if (local_290.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_290.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_001043bc:
  sptk::PseudoQuadratureMirrorFilterBanks::Buffer::~Buffer(&local_2b0);
  local_278._vptr_PseudoQuadratureMirrorFilterBanks =
       (_func_int **)&PTR__PseudoQuadratureMirrorFilterBanks_00113b78;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_278.filter_banks_);
LAB_001043e1:
  std::ifstream::~ifstream(&local_238);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_subband(kDefaultNumSubband);
  int num_filter_order(kDefaultNumFilterOrder);
  double attenuation(kDefaultAttenuation);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double initial_step_size(kDefaultInitialStepSize);
  bool delay_compensation(kDefaultDelayCompensation);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "k:m:a:i:d:s:rh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'k': {
        if (!sptk::ConvertStringToInteger(optarg, &num_subband) ||
            num_subband <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -k option must be a positive integer";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order <= 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -m option must be greater than 1";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &attenuation) ||
            attenuation <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be a positive number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -i option must be a positive integer";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToDouble(optarg, &initial_step_size) ||
            initial_step_size <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -s option must be a positive number";
          sptk::PrintErrorMessage("pqmf", error_message);
          return 1;
        }
        break;
      }
      case 'r': {
        delay_compensation = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pqmf", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::PseudoQuadratureMirrorFilterBanks analysis(
      num_subband, num_filter_order, attenuation, num_iteration,
      convergence_threshold, initial_step_size);
  sptk::PseudoQuadratureMirrorFilterBanks::Buffer buffer;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PseudoQuadratureMirrorFilterBanks";
    sptk::PrintErrorMessage("pqmf", error_message);
    return 1;
  }

  double input;
  std::vector<double> output(num_subband);
  const int delay(sptk::IsEven(num_filter_order) ? num_filter_order / 2
                                                 : (num_filter_order - 1) / 2);

  int num_read(0);
  while (sptk::ReadStream(&input, &input_stream)) {
    if (!analysis.Run(input, &output, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to perform PQMF analysis";
      sptk::PrintErrorMessage("pqmf", error_message);
      return 1;
    }
    if (!delay_compensation || delay <= num_read++) {
      if (!sptk::WriteStream(0, num_subband, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write subband signals";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
    }
  }

  if (delay_compensation) {
    const int n(std::min(delay, num_read));
    for (int i(0); i < n; ++i) {
      if (!analysis.Run(input, &output, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to perform PQMF analysis";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
      if (!sptk::WriteStream(0, num_subband, output, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write subband signals";
        sptk::PrintErrorMessage("pqmf", error_message);
        return 1;
      }
    }
  }

  return 0;
}